

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaParserCtxtPtr xmlSchemaNewParserCtxt(char *URL)

{
  xmlSchemaParserCtxtPtr pxVar1;
  xmlDictPtr dict;
  xmlChar *pxVar2;
  
  if ((URL != (char *)0x0) &&
     (pxVar1 = xmlSchemaParserCtxtCreate(), pxVar1 != (xmlSchemaParserCtxtPtr)0x0)) {
    dict = xmlDictCreate();
    pxVar1->dict = dict;
    pxVar2 = xmlDictLookup(dict,(xmlChar *)URL,-1);
    pxVar1->URL = pxVar2;
    return pxVar1;
  }
  return (xmlSchemaParserCtxtPtr)0x0;
}

Assistant:

xmlSchemaParserCtxtPtr
xmlSchemaNewParserCtxt(const char *URL)
{
    xmlSchemaParserCtxtPtr ret;

    if (URL == NULL)
        return (NULL);

    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
	return(NULL);
    ret->dict = xmlDictCreate();
    ret->URL = xmlDictLookup(ret->dict, (const xmlChar *) URL, -1);
    return (ret);
}